

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::detail::resolveSymlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  ssize_t sVar5;
  int *piVar6;
  error_category *peVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  _Alloc_hider _Var9;
  size_type __n;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_69;
  _Alloc_hider local_68;
  ulong local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<char,_std::allocator<char>_> local_48;
  
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  __n = 0x100;
  do {
    local_68._M_p = local_68._M_p & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::vector
              (&local_48,__n,(value_type *)&local_68,&local_69);
    sVar5 = readlink((p->_path)._M_dataplus._M_p,
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
    if (sVar5 < 0) {
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      peVar7 = (error_category *)std::_V2::system_category();
      ec->_M_value = iVar2;
      ec->_M_cat = peVar7;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
LAB_00107eb7:
      bVar3 = false;
    }
    else {
      if (sVar5 < (int)__n) {
        local_68._M_p = (pointer)&local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar5);
        uVar4 = local_60;
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_p == &local_58) {
          *(undefined4 *)paVar1 = local_58._M_allocated_capacity._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 4) =
               local_58._M_allocated_capacity._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = local_58._8_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 0xc) = local_58._12_4_;
          _Var9._M_p = (pointer)paVar1;
        }
        else {
          (__return_storage_ptr__->_path)._M_dataplus._M_p = local_68._M_p;
          (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
               CONCAT44(local_58._M_allocated_capacity._4_4_,local_58._M_allocated_capacity._0_4_);
          _Var9._M_p = local_68._M_p;
        }
        (__return_storage_ptr__->_path)._M_string_length = local_60;
        local_60 = 0;
        local_58._M_allocated_capacity._0_4_ = local_58._M_allocated_capacity._0_4_ & 0xffffff00;
        if ((((uVar4 < 3) || (*_Var9._M_p != '/')) || (_Var9._M_p[1] != '/')) ||
           (_Var9._M_p[2] == '/')) {
          local_68._M_p = (pointer)&local_58;
          _Var8 = std::
                  __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                            (_Var9._M_p,(char *)(uVar4 + (long)_Var9._M_p));
        }
        else {
          local_68._M_p = (pointer)&local_58;
          _Var8 = std::
                  __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                            ((char *)((long)_Var9._M_p + 2),(char *)(uVar4 + (long)_Var9._M_p));
        }
        (__return_storage_ptr__->_path)._M_string_length =
             (long)_Var8._M_current - (long)(__return_storage_ptr__->_path)._M_dataplus._M_p;
        *_Var8._M_current = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_p != &local_58) {
          operator_delete(local_68._M_p,
                          CONCAT44(local_58._M_allocated_capacity._4_4_,
                                   local_58._M_allocated_capacity._0_4_) + 1);
        }
        goto LAB_00107eb7;
      }
      __n = __n * 2;
      bVar3 = true;
    }
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

GHC_INLINE path resolveSymlink(const path& p, std::error_code& ec)
{
#ifdef GHC_OS_WINDOWS
#ifndef REPARSE_DATA_BUFFER_HEADER_SIZE
    typedef struct _REPARSE_DATA_BUFFER
    {
        ULONG ReparseTag;
        USHORT ReparseDataLength;
        USHORT Reserved;
        union
        {
            struct
            {
                USHORT SubstituteNameOffset;
                USHORT SubstituteNameLength;
                USHORT PrintNameOffset;
                USHORT PrintNameLength;
                ULONG Flags;
                WCHAR PathBuffer[1];
            } SymbolicLinkReparseBuffer;
            struct
            {
                USHORT SubstituteNameOffset;
                USHORT SubstituteNameLength;
                USHORT PrintNameOffset;
                USHORT PrintNameLength;
                WCHAR PathBuffer[1];
            } MountPointReparseBuffer;
            struct
            {
                UCHAR DataBuffer[1];
            } GenericReparseBuffer;
        } DUMMYUNIONNAME;
    } REPARSE_DATA_BUFFER;
#ifndef MAXIMUM_REPARSE_DATA_BUFFER_SIZE
#define MAXIMUM_REPARSE_DATA_BUFFER_SIZE (16 * 1024)
#endif
#endif

    std::shared_ptr<void> file(CreateFileW(GHC_NATIVEWP(p), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_OPEN_REPARSE_POINT | FILE_FLAG_BACKUP_SEMANTICS, 0), CloseHandle);
    if (file.get() == INVALID_HANDLE_VALUE) {
        ec = detail::make_system_error();
        return path();
    }

    std::shared_ptr<REPARSE_DATA_BUFFER> reparseData((REPARSE_DATA_BUFFER*)std::calloc(1, MAXIMUM_REPARSE_DATA_BUFFER_SIZE), std::free);
    ULONG bufferUsed;
    path result;
    if (DeviceIoControl(file.get(), FSCTL_GET_REPARSE_POINT, 0, 0, reparseData.get(), MAXIMUM_REPARSE_DATA_BUFFER_SIZE, &bufferUsed, 0)) {
        if (IsReparseTagMicrosoft(reparseData->ReparseTag)) {
            switch (reparseData->ReparseTag) {
                case IO_REPARSE_TAG_SYMLINK: {
                    auto printName = std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.PrintNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.PrintNameLength / sizeof(WCHAR));
                    auto substituteName =
                        std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.SubstituteNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.SubstituteNameLength / sizeof(WCHAR));
                    if (detail::endsWith(substituteName, printName) && detail::startsWith(substituteName, std::wstring(L"\\??\\"))) {
                        result = printName;
                    }
                    else {
                        result = substituteName;
                    }
                    if (reparseData->SymbolicLinkReparseBuffer.Flags & 0x1 /*SYMLINK_FLAG_RELATIVE*/) {
                        result = p.parent_path() / result;
                    }
                    break;
                }
                case IO_REPARSE_TAG_MOUNT_POINT:
                    result = std::wstring(&reparseData->MountPointReparseBuffer.PathBuffer[reparseData->MountPointReparseBuffer.SubstituteNameOffset / sizeof(WCHAR)], reparseData->MountPointReparseBuffer.SubstituteNameLength / sizeof(WCHAR));
                    break;
                default:
                    break;
            }
        }
    }
    else {
        ec = detail::make_system_error();
    }
    return result;
#else
    size_t bufferSize = 256;
    while (true) {
        std::vector<char> buffer(bufferSize, static_cast<char>(0));
        auto rc = ::readlink(p.c_str(), buffer.data(), buffer.size());
        if (rc < 0) {
            ec = detail::make_system_error();
            return path();
        }
        else if (rc < static_cast<int>(bufferSize)) {
            return path(std::string(buffer.data(), static_cast<std::string::size_type>(rc)));
        }
        bufferSize *= 2;
    }
    return path();
#endif
}